

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNdr.c
# Opt level: O0

void Wlc_NtkToNdrTest(Wlc_Ntk_t *pNtk)

{
  int iVar1;
  void *pDesign_00;
  char **pNames;
  char *pcVar2;
  char **ppNames;
  int i;
  Wlc_Obj_t *pObj;
  void *pDesign;
  Wlc_Ntk_t *pNtk_local;
  
  pDesign_00 = Wlc_NtkToNdr(pNtk);
  iVar1 = Wlc_NtkObjNum(pNtk);
  pNames = (char **)malloc((long)(iVar1 + 1) << 3);
  for (ppNames._4_4_ = 1; iVar1 = Wlc_NtkObjNumMax(pNtk), ppNames._4_4_ < iVar1;
      ppNames._4_4_ = ppNames._4_4_ + 1) {
    Wlc_NtkObj(pNtk,ppNames._4_4_);
    pcVar2 = Wlc_ObjName(pNtk,ppNames._4_4_);
    pNames[ppNames._4_4_] = pcVar2;
  }
  Ndr_WriteVerilog((char *)0x0,pDesign_00,pNames);
  Ndr_Write("test.ndr",pDesign_00);
  Ndr_Delete(pDesign_00);
  if (pNames != (char **)0x0) {
    free(pNames);
  }
  return;
}

Assistant:

void Wlc_NtkToNdrTest( Wlc_Ntk_t * pNtk )
{
    // transform
    void * pDesign = Wlc_NtkToNdr( pNtk );

    // collect names     
    Wlc_Obj_t * pObj;  int i;
    char ** ppNames = ABC_ALLOC( char *, Wlc_NtkObjNum(pNtk) + 1 );
    Wlc_NtkForEachObj( pNtk, pObj, i ) 
        ppNames[i] = Wlc_ObjName(pNtk, i);

    // verify by writing Verilog
    Ndr_WriteVerilog( NULL, pDesign, ppNames );
    Ndr_Write( "test.ndr", pDesign );

    // cleanup
    Ndr_Delete( pDesign );
    ABC_FREE( ppNames );
}